

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

int INT_REVaction_set_output
              (CMConnection conn,EVstone stone,EVaction action,int output_index,EVstone target_stone
              )

{
  int iVar1;
  CMFormat p_Var2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int in_R8D;
  EVaction_set_output_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int condition;
  int iVar3;
  
  memset(&stack0xffffffffffffffbc,0,0x14);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EVaction_set_output_req_formats);
  condition = iVar1;
  iVar3 = in_R8D;
  if (p_Var2 == (CMFormat)0x0) {
    INT_CMregister_format
              ((CManager)CONCAT44(in_R8D,in_ECX),(FMStructDescList)CONCAT44(in_EDX,in_ESI));
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_R8D,
             (void *)CONCAT44(in_EDX,in_ESI));
  INT_CMwrite((CMConnection)CONCAT44(in_EDX,in_ESI),
              (CMFormat)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(void *)0x1545bd);
  INT_CMCondition_wait((CManager)CONCAT44(in_ECX,iVar3),condition);
  return in_stack_ffffffffffffffd4;
}

Assistant:

extern int
INT_REVaction_set_output(CMConnection conn, EVstone stone, EVaction action, int output_index, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVaction_set_output_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVaction_set_output_req_formats);
    request.stone = stone;
    request.action = action;
    request.output_index = output_index;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVaction_set_output_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return response.ret;
}